

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O3

void msocket_ary_destroy(msocket_ary_t *self)

{
  void **ppvVar1;
  long lVar2;
  
  if (((self->pDestructor != (_func_void_void_ptr *)0x0) && (self->destructorEnable == true)) &&
     (0 < self->s32CurLen)) {
    ppvVar1 = self->pFirst;
    lVar2 = 0;
    do {
      (*self->pDestructor)(ppvVar1[lVar2]);
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 < self->s32CurLen);
  }
  if (self->ppAlloc != (void **)0x0) {
    free(self->ppAlloc);
  }
  self->ppAlloc = (void **)0x0;
  self->pFirst = (void **)0x0;
  self->s32AllocLen = 0;
  self->s32CurLen = 0;
  return;
}

Assistant:

void msocket_ary_destroy(msocket_ary_t* self) {
   int32_t s32i;

   void** ppElem = self->pFirst;
   if ((self->pDestructor != 0) && (self->destructorEnable != false)) {
      for (s32i = 0; s32i < (int32_t)self->s32CurLen; s32i++) {
         self->pDestructor(*(ppElem++));
      }
   }
   if (self->ppAlloc != 0) {
      free(self->ppAlloc);
   }
   self->ppAlloc = (void**)0;
   self->s32AllocLen = 0;
   self->pFirst = (void**)0;
   self->s32CurLen = 0;
}